

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

void __thiscall CentralBroker::create(CentralBroker *this,char *endP)

{
  void *self;
  _Bool _Var1;
  bool bVar2;
  int iVar3;
  zactor_t *pzVar4;
  undefined8 uVar5;
  BrokerClient *this_00;
  zactor_t *broker;
  char *in_RSI;
  undefined8 *in_RDI;
  zrex_t *addr_rex;
  BrokerClient *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  char *id;
  allocator local_39;
  string local_38 [32];
  zrex_t *local_18;
  char *local_10;
  
  *(undefined1 *)((long)in_RDI + 0x5c) = 0;
  local_10 = in_RSI;
  std::__cxx11::string::assign((char *)(in_RDI + 3));
  pzVar4 = zactor_new(mlm_server,(void *)0x0);
  *in_RDI = pzVar4;
  self = (void *)*in_RDI;
  uVar5 = std::__cxx11::string::c_str();
  zsock_send(self,"ss","BIND",uVar5);
  zsock_send((void *)*in_RDI,"sss","SET","server/timeout","5000");
  local_18 = zrex_new("(.*):(\\d*)");
  _Var1 = zrex_matches(local_18,local_10);
  if (!_Var1) {
    std::operator<<((ostream *)&std::cout,
                    "Error: Could not start broker handle. (CentralBroker::CentralBroker)\n");
  }
  id = (char *)(in_RDI + 7);
  zrex_hit(local_18,1);
  std::__cxx11::string::assign(id);
  this_00 = (BrokerClient *)zrex_hit(local_18,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,(char *)this_00,&local_39);
  iVar3 = std::__cxx11::stoi(in_stack_ffffffffffffff70,(size_t *)in_stack_ffffffffffffff68,0);
  *(int *)(in_RDI + 0xb) = iVar3;
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  zrex_destroy(&local_18);
  broker = (zactor_t *)operator_new(0x130);
  pzVar4 = broker;
  std::__cxx11::string::c_str();
  BrokerClient::BrokerClient
            (this_00,id,(char *)CONCAT44(iVar3,in_stack_ffffffffffffff80),
             (int)((ulong)pzVar4 >> 0x20),broker);
  in_RDI[2] = broker;
  bVar2 = BrokerClient::start(in_stack_ffffffffffffff68);
  if (bVar2) {
    pzVar4 = zactor_new(logging_reactor_task,in_RDI);
    in_RDI[1] = pzVar4;
    *(undefined1 *)((long)in_RDI + 0x5c) = 1;
  }
  return;
}

Assistant:

void CentralBroker::create(const char *endP){
    initialized = false;
    endpoint.assign(endP);

    broker = zactor_new(mlm_server, NULL);

    //Bind broker to endpoint
    zsock_send(broker, "ss", "BIND", endpoint.c_str());
    //Set server timeouts to be 5000 ms
    zsock_send (broker, "sss", "SET", "server/timeout", "5000");

    //group 1 = anything before the colon, address
    //group 2 = any number of digits after colon, port
    zrex_t *addr_rex = zrex_new("(.*):(\\d*)");
    if(!zrex_matches(addr_rex, endP)){
        std::cout << "Error: Could not start broker handle. (CentralBroker::CentralBroker)\n";
    }
    address.assign(zrex_hit(addr_rex, 1));
    port = std::stoi(zrex_hit(addr_rex, 2));
    zrex_destroy(&addr_rex);

    //Start broker client
    brokerHandle = new BrokerClient(BROKER_NETWORK_ID, address.c_str(), port, broker);
    if(!brokerHandle->start()){
        return;
    }

    //Create thread for Broker Client that forwards logs to itself and parses it
    //TODO: just integrate this into the BrokerClient class
    logger = zactor_new(&CentralBroker::logging_reactor_task, this);
    initialized = true;
}